

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void charevnt_wander_left(tgestate_t *state,route_t *route)

{
  route->index = 0xff;
  route->step = '\x10';
  return;
}

Assistant:

void charevnt_wander_left(tgestate_t *state, route_t *route)
{
  // When .x is set to $FF it says to pick a random location from the
  // locations[] array from .y to .y+7.

  // Set route to wander between random locations in the left part of the map:
  //    _________________               |
  //   |*******          |              |
  //   |*******          |______________|
  //   |*******                     :   :
  //   |*******HUT   HUT   HUT      :   :
  //  _|*******ONE   TWO   TRE     X:   :
  // | ********HUT   HUT   HUT      :   :
  // | ********ONE   TWO   TRE      :   :
  //  |                            X:   :
  // _|_______GATE_|~~~~~~~DD~~~~~~~'   :
  //              :                     :
  //              :~~~~~~~~DD~~~~~~~~~~~'
  //             X:             :
  //              :             :
  //              :            X:
  //              '~~~~~~~~~~~~~'

  route->index = routeindex_255_WANDER;
  route->step  = 16; /* 16..23 */
}